

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptOperators::CacheIteratorNext(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  ThreadContext *this;
  bool bVar1;
  Var aValue;
  RecyclableObject *pRVar2;
  
  aValue = GetPropertyNoCache(iterator,0x107,scriptContext);
  this = scriptContext->threadContext;
  bVar1 = JavascriptConversion::IsCallable(aValue);
  if (bVar1) {
    pRVar2 = VarTo<Js::RecyclableObject>(aValue);
    return pRVar2;
  }
  bVar1 = ThreadContext::RecordImplicitException(this);
  if (!bVar1) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::CacheIteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        Var nextFunc = JavascriptOperators::GetPropertyNoCache(iterator, PropertyIds::next, scriptContext);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        if (!JavascriptConversion::IsCallable(nextFunc))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        return VarTo<RecyclableObject>(nextFunc);
    }